

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void testing::internal::DeathTestAbort(string *message)

{
  int fd;
  UnitTestImpl *this;
  InternalRunDeathTestFlag *this_00;
  FILE *pFVar1;
  undefined8 uVar2;
  FILE *parent;
  InternalRunDeathTestFlag *flag;
  string *message_local;
  
  this = GetUnitTestImpl();
  this_00 = UnitTestImpl::internal_run_death_test_flag(this);
  if (this_00 != (InternalRunDeathTestFlag *)0x0) {
    fd = InternalRunDeathTestFlag::write_fd(this_00);
    pFVar1 = (FILE *)posix::FDOpen(fd,"w");
    fputc(0x49,pFVar1);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s",uVar2);
    fflush(pFVar1);
    _Exit(1);
  }
  pFVar1 = _stderr;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s",uVar2);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

[[noreturn]] static void DeathTestAbort(const std::string& message) {
  // On a POSIX system, this function may be called from a threadsafe-style
  // death test child process, which operates on a very small stack.  Use
  // the heap for any additional non-minuscule memory requirements.
  const InternalRunDeathTestFlag* const flag =
      GetUnitTestImpl()->internal_run_death_test_flag();
  if (flag != nullptr) {
    FILE* parent = posix::FDOpen(flag->write_fd(), "w");
    fputc(kDeathTestInternalError, parent);
    fprintf(parent, "%s", message.c_str());
    fflush(parent);
    _Exit(1);
  } else {
    fprintf(stderr, "%s", message.c_str());
    fflush(stderr);
    posix::Abort();
  }
}